

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O2

bool __thiscall raptor::Server::Start(Server *this)

{
  raptor_error e;
  string local_28;
  
  TcpServer::Start((TcpServer *)&e);
  if (e._value != (Status *)0x0) {
    Status::ToString_abi_cxx11_(&local_28,e._value);
    LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/surface/server.cc"
                   ,0x47,kLogLevelError,"server: start (%s)",local_28._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_28);
  }
  RefCountedPtr<raptor::Status>::~RefCountedPtr(&e);
  return e._value == (Status *)0x0;
}

Assistant:

bool Server::Start() {
    raptor_error e = _impl->Start();
    if (e != RAPTOR_ERROR_NONE) {
        log_error("server: start (%s)", e->ToString().c_str());
        return false;
    }

    return true;
}